

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O0

void AdjustSpriteOffsets(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FTexture *this;
  int wadno;
  int lumpnum;
  FTexture *tex;
  int local_148;
  FTextureID texno;
  int y;
  int x;
  int ofslumpno;
  undefined1 local_130 [8];
  FScanner sc;
  char local_28 [4];
  int lump;
  char name [30];
  
  if (!AdjustSpriteOffsets::done) {
    AdjustSpriteOffsets::done = true;
    mysnprintf(local_28,0x1e,"sprofs/%s.sprofs");
    sc._252_4_ = FWadCollection::CheckNumForFullName(&Wads,local_28,false,0);
    if (-1 < (int)sc._252_4_) {
      FScanner::FScanner((FScanner *)local_130);
      FScanner::OpenLumpNum((FScanner *)local_130,sc._252_4_);
      FGLRenderer::FlushTextures(GLRenderer);
      iVar2 = FWadCollection::GetLumpFile(&Wads,sc._252_4_);
      while (bVar1 = FScanner::GetString((FScanner *)local_130), bVar1) {
        tex._4_4_ = FTextureManager::CheckForTexture(&TexMan,(char *)local_130,3,1);
        FScanner::GetNumber((FScanner *)local_130);
        texno.texnum = sc.StringLen;
        FScanner::GetNumber((FScanner *)local_130);
        local_148 = sc.StringLen;
        bVar1 = FTextureID::isValid((FTextureID *)((long)&tex + 4));
        if (bVar1) {
          this = FTextureManager::operator[](&TexMan,tex._4_4_);
          iVar3 = (*this->_vptr_FTexture[6])();
          if (((-1 < iVar3) && (iVar4 = FWadCollection::GetNumLumps(&Wads), iVar3 < iVar4)) &&
             ((iVar3 = FWadCollection::GetLumpFile(&Wads,iVar3), iVar3 == 1 || (iVar3 == iVar2)))) {
            this->LeftOffset = (SWORD)texno.texnum;
            this->TopOffset = (SWORD)local_148;
            FTexture::KillNative(this);
          }
        }
      }
      FScanner::~FScanner((FScanner *)local_130);
    }
  }
  return;
}

Assistant:

void AdjustSpriteOffsets()
{
	static bool done=false;
	char name[30];

	if (done) return;
	done=true;

	mysnprintf(name, countof(name), "sprofs/%s.sprofs", GameNames[gameinfo.gametype]);
	int lump = Wads.CheckNumForFullName(name);
	if (lump>=0)
	{
		FScanner sc;
		sc.OpenLumpNum(lump);
		GLRenderer->FlushTextures();
		int ofslumpno = Wads.GetLumpFile(lump);
		while (sc.GetString())
		{
			int x,y;
			FTextureID texno = TexMan.CheckForTexture(sc.String, FTexture::TEX_Sprite);
			sc.GetNumber();
			x=sc.Number;
			sc.GetNumber();
			y=sc.Number;

			if (texno.isValid())
			{
				FTexture * tex = TexMan[texno];

				int lumpnum = tex->GetSourceLump();
				// We only want to change texture offsets for sprites in the IWAD or the file this lump originated from.
				if (lumpnum >= 0 && lumpnum < Wads.GetNumLumps())
				{
					int wadno = Wads.GetLumpFile(lumpnum);
					if (wadno==FWadCollection::IWAD_FILENUM || wadno == ofslumpno)
					{
						tex->LeftOffset=x;
						tex->TopOffset=y;
						tex->KillNative();
					}
				}
			}
		}
	}
}